

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::
get_value<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
          (GeomPrimvar *this,double timecode,
          vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *dest,
          TimeSampleInterpolationType interp,string *err)

{
  bool bVar1;
  uint32_t tyid;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Attribute *this_00;
  allocator local_c1;
  double local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined8 local_98;
  string local_90;
  string local_70 [32];
  string local_50;
  
  local_b8._0_8_ = timecode;
  if (dest != (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)0x0) {
    this_00 = &this->_attr;
    args = err;
    local_c0 = timecode;
    bVar1 = Attribute::is_blocked(this_00);
    if (!bVar1) {
      tyid = Attribute::type_id(this_00);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (bVar1) {
        local_a8._M_allocated_capacity = 0;
        local_a8._8_8_ = 0;
        local_98 = 0;
        bVar1 = Attribute::
                get<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                          (this_00,local_c0,
                           (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                            *)(local_b8 + 0x10),interp);
        if (bVar1) {
          std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
          operator=(dest,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                          *)(local_b8 + 0x10));
        }
        else if (err != (string *)0x0) {
          std::__cxx11::string::string
                    (local_70,
                     "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                     ,&local_c1);
          local_b8._12_4_ = 0x10003e;
          Attribute::type_name_abi_cxx11_(&local_90,this_00);
          fmt::format<double,unsigned_int,std::__cxx11::string>
                    (&local_50,(fmt *)local_70,(string *)local_b8,(double *)(local_b8 + 0xc),
                     (uint *)&local_90,in_R9);
          std::__cxx11::string::append((string *)err);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
        }
        std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                       *)(local_b8 + 0x10));
        return bVar1;
      }
      if (err == (string *)0x0) {
        return false;
      }
      std::__cxx11::string::string
                (local_70,"Unsupported type for GeomPrimvar. type = `{}`",
                 (allocator *)(local_b8 + 0x10));
      Attribute::type_name_abi_cxx11_(&local_90,this_00);
      fmt::format<std::__cxx11::string>(&local_50,(fmt *)local_70,&local_90,args);
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      return false;
    }
  }
  if (err != (string *)0x0) {
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}